

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.cc
# Opt level: O0

int DSA_set0_key(DSA *dsa,BIGNUM *pub_key,BIGNUM *priv_key)

{
  BIGNUM *priv_key_local;
  BIGNUM *pub_key_local;
  DSA *dsa_local;
  
  if ((dsa->pub_key == (BIGNUM *)0x0) && (pub_key == (BIGNUM *)0x0)) {
    dsa_local._4_4_ = 0;
  }
  else {
    if (pub_key != (BIGNUM *)0x0) {
      BN_free((BIGNUM *)dsa->pub_key);
      dsa->pub_key = pub_key;
    }
    if (priv_key != (BIGNUM *)0x0) {
      BN_free((BIGNUM *)dsa->priv_key);
      dsa->priv_key = priv_key;
    }
    dsa_local._4_4_ = 1;
  }
  return dsa_local._4_4_;
}

Assistant:

int DSA_set0_key(DSA *dsa, BIGNUM *pub_key, BIGNUM *priv_key) {
  if (dsa->pub_key == NULL && pub_key == NULL) {
    return 0;
  }

  if (pub_key != NULL) {
    BN_free(dsa->pub_key);
    dsa->pub_key = pub_key;
  }
  if (priv_key != NULL) {
    BN_free(dsa->priv_key);
    dsa->priv_key = priv_key;
  }

  return 1;
}